

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

uint32_t helper_pack_tricore(uint32_t carry,uint32_t r1_low,uint32_t r1_high,
                            target_ulong_conflict r2)

{
  uint32_t uVar1;
  bool local_3a;
  bool local_39;
  uint32_t flag_rnd;
  int32_t int_mant;
  int32_t int_exp;
  int32_t fp_exp_frac;
  int32_t temp_exp;
  int32_t fp_frac;
  int32_t fp_exp;
  uint32_t ret;
  target_ulong_conflict r2_local;
  uint32_t r1_high_local;
  uint32_t r1_low_local;
  uint32_t carry_local;
  
  local_39 = false;
  if ((r1_low & 0x80) != 0) {
    local_3a = true;
    if (((r1_low & 0x100) == 0) && (local_3a = true, (r1_low & 0x7f) == 0)) {
      local_3a = carry != 0;
    }
    local_39 = local_3a;
  }
  if (((r1_low & 0x80000000) == 0) && (r1_high == 0xff)) {
    temp_exp = 0xff;
    fp_exp_frac = extract32(r1_low,8,0x17);
  }
  else if (((r1_low & 0x80000000) == 0) || ((int)r1_high < 0x7f)) {
    if (((r1_low & 0x80000000) == 0) || (-0x80 < (int)r1_high)) {
      if (r1_low == 0) {
        temp_exp = 0;
        fp_exp_frac = 0;
      }
      else {
        if ((r1_low & 0x80000000) == 0) {
          int_exp = 0;
        }
        else {
          int_exp = r1_high + 0x80;
        }
        uVar1 = extract32(r1_low,8,0x17);
        uVar1 = ((int_exp & 0xffU) << 0x17 | uVar1) + (uint)local_39;
        temp_exp = extract32(uVar1,0x17,8);
        fp_exp_frac = extract32(uVar1,0,0x17);
      }
    }
    else {
      temp_exp = 0;
      fp_exp_frac = 0;
    }
  }
  else {
    temp_exp = 0xff;
    fp_exp_frac = 0;
  }
  return (r2 & 0x80000000) + temp_exp * 0x800000 + (fp_exp_frac & 0x7fffffU);
}

Assistant:

uint32_t helper_pack(uint32_t carry, uint32_t r1_low, uint32_t r1_high,
                     target_ulong r2)
{
    uint32_t ret;
    int32_t fp_exp, fp_frac, temp_exp, fp_exp_frac;
    int32_t int_exp  = r1_high;
    int32_t int_mant = r1_low;
    uint32_t flag_rnd = (int_mant & (1 << 7)) && (
                        (int_mant & (1 << 8)) ||
                        (int_mant & 0x7f)     ||
                        (carry != 0));
    if (((int_mant & (1<<31)) == 0) && (int_exp == 255)) {
        fp_exp = 255;
        fp_frac = extract32(int_mant, 8, 23);
    } else if ((int_mant & (1<<31)) && (int_exp >= 127)) {
        fp_exp  = 255;
        fp_frac = 0;
    } else if ((int_mant & (1<<31)) && (int_exp <= -128)) {
        fp_exp  = 0;
        fp_frac = 0;
    } else if (int_mant == 0) {
        fp_exp  = 0;
        fp_frac = 0;
    } else {
        if (((int_mant & (1 << 31)) == 0)) {
            temp_exp = 0;
        } else {
            temp_exp = int_exp + 128;
        }
        fp_exp_frac = (((temp_exp & 0xff) << 23) |
                      extract32(int_mant, 8, 23))
                      + flag_rnd;
        fp_exp  = extract32(fp_exp_frac, 23, 8);
        fp_frac = extract32(fp_exp_frac, 0, 23);
    }
    ret = r2 & (1 << 31);
    ret = ret + (fp_exp << 23);
    ret = ret + (fp_frac & 0x7fffff);

    return ret;
}